

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzReadHeader2(CSzArEx *p,CSzData *sd,ILookInStream *inStream,CBuf *tempBufs,UInt32 *numTempBufs
                  ,ISzAlloc *allocMain,ISzAlloc *allocTemp)

{
  Byte BVar1;
  char cVar2;
  Byte *pBVar3;
  long lVar4;
  SRes SVar5;
  uint uVar6;
  UInt32 *pUVar7;
  size_t *psVar8;
  UInt64 UVar9;
  long in_RCX;
  char *pcVar10;
  CSzData *in_RSI;
  CSzAr *in_RDI;
  uint *in_R8;
  CSzAr *in_R9;
  ISzAlloc *in_stack_00000008;
  int __result___24;
  UInt32 byteIndex_1;
  int __result___23;
  UInt64 v;
  UInt64 startFolderUnpackPos;
  UInt64 folderUnpackSize_1;
  UInt64 folderUnpackSize;
  int __result___22;
  UInt32 byteIndex;
  size_t numBytes;
  int __result___21;
  Byte mask;
  Byte crcMask;
  Byte isDirMask;
  Byte allDigestsDefined;
  UInt32 digestIndex;
  UInt32 digestsValsIndex;
  Byte *digestsVals;
  Byte *digestsDefs;
  UInt64 unpackPos;
  UInt32 numSubStreams;
  UInt32 remSubStreams;
  UInt32 folderIndex;
  UInt32 emptyFileIndex;
  UInt32 i;
  int __result___20;
  int __result___19;
  UInt64 type_3;
  int __result___18;
  int __result___17;
  int __result___16;
  int __result___15;
  UInt32 index_1;
  int __result___14;
  CSzData *sdPtr;
  CSzData sdSwitch;
  Byte external_1;
  int __result___13;
  int __result___12;
  int __result___11;
  int __result___10;
  UInt32 index;
  Byte external;
  Byte *namesData;
  size_t namesSize;
  int __result___9;
  int __result___8;
  UInt64 size;
  UInt64 type_2;
  int __result___7;
  int __result___6;
  int __result___5;
  int __result___4;
  SRes res;
  CSzAr tempAr;
  int __result___3;
  int __result___2;
  int __result___1;
  UInt64 type_1;
  int __result__;
  Byte *emptyFiles;
  Byte *emptyStreams;
  CSubStreamInfo ssi;
  UInt32 numEmptyStreams;
  UInt32 numFiles;
  UInt64 type;
  ISzAlloc *in_stack_fffffffffffffdc8;
  CSzAr *in_stack_fffffffffffffdd0;
  CSzData *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  uint in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  UInt32 in_stack_fffffffffffffdf4;
  CSzData *in_stack_fffffffffffffdf8;
  ISzAlloc *in_stack_fffffffffffffe00;
  CSzData *in_stack_fffffffffffffe08;
  UInt32 numTempBufs_00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  CSzAr *in_stack_fffffffffffffe18;
  undefined1 uVar12;
  byte bVar13;
  undefined1 uVar14;
  byte bVar15;
  UInt32 in_stack_fffffffffffffe24;
  uint uVar11;
  undefined2 uVar16;
  undefined4 in_stack_fffffffffffffe28;
  uint uVar17;
  undefined4 in_stack_fffffffffffffe2c;
  uint uVar18;
  CSubStreamInfo *in_stack_fffffffffffffe30;
  char *pcVar19;
  ISzAlloc *in_stack_fffffffffffffe38;
  char *pcVar20;
  CSzAr *in_stack_fffffffffffffe40;
  ulong uVar21;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int iVar22;
  int local_1b0;
  UInt32 in_stack_fffffffffffffe54;
  uint folderIndex_00;
  undefined4 in_stack_fffffffffffffe58;
  uint uVar23;
  undefined4 in_stack_fffffffffffffe5c;
  uint uVar24;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  ILookInStream *in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  uint local_148;
  Byte *local_140;
  ulong local_138;
  ulong local_128;
  int local_120;
  undefined4 uStack_11c;
  undefined4 local_114;
  undefined4 local_110;
  SRes local_10c;
  undefined4 local_108;
  int local_104;
  CSzAr local_100;
  undefined4 local_ac;
  undefined4 local_a8;
  SRes local_a4;
  UInt64 local_a0;
  undefined4 local_94;
  Byte *local_90;
  Byte *local_88;
  ISzAlloc local_80;
  long local_70;
  CSzData local_68;
  char *local_58;
  long local_50;
  UInt32 local_48;
  UInt32 local_44;
  UInt64 local_40;
  CSzAr *local_38;
  uint *local_30;
  long local_28;
  CSzData *local_18;
  CSzAr *local_10;
  SRes local_4;
  
  local_44 = 0;
  local_48 = 0;
  local_88 = (Byte *)0x0;
  local_90 = (Byte *)0x0;
  local_68.Data = (Byte *)0x0;
  local_68.Size = 0;
  local_58 = (char *)0x0;
  local_50 = 0;
  local_80.Free = (_func_void_void_ptr_void_ptr *)0x0;
  local_70 = 0;
  local_80.Alloc._4_4_ = 0;
  local_80.Alloc._0_4_ = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  SVar5 = ReadNumber(in_RSI,&local_40);
  if (SVar5 != 0) {
    return SVar5;
  }
  local_94 = 0;
  if (local_40 == 2) {
    while( true ) {
      local_a4 = ReadNumber(local_18,&local_a0);
      if (local_a4 != 0) {
        return local_a4;
      }
      if (local_a0 == 0) break;
      SVar5 = SkipData(in_stack_fffffffffffffdd8);
      if (SVar5 != 0) {
        return SVar5;
      }
      local_a8 = 0;
    }
    SVar5 = ReadNumber(local_18,&local_40);
    if (SVar5 != 0) {
      return SVar5;
    }
    local_ac = 0;
  }
  if (local_40 == 3) {
    SzAr_Init(&local_100);
    local_104 = SzReadAndDecodePackedStreams
                          (in_stack_fffffffffffffe68,
                           (CSzData *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           (CBuf *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe54,
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                           in_stack_fffffffffffffe40,
                           (ISzAlloc *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                          );
    *local_30 = local_100.NumFolders;
    SzAr_Free(in_stack_fffffffffffffdd0,in_stack_00000008);
    if (local_104 != 0) {
      return local_104;
    }
    SVar5 = ReadNumber(local_18,&local_40);
    if (SVar5 != 0) {
      return SVar5;
    }
    local_108 = 0;
    in_stack_fffffffffffffdc8 = in_stack_00000008;
  }
  if (local_40 == 4) {
    in_stack_fffffffffffffdc8 = &local_80;
    in_stack_fffffffffffffdd0 = local_38;
    local_10c = SzReadStreamsInfo(in_stack_fffffffffffffe18,
                                  (CSzData *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  (UInt32)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                                  (CBuf *)in_stack_fffffffffffffe00,
                                  (UInt32)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                                  (UInt64 *)
                                  CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                  in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
    if (local_10c != 0) {
      return local_10c;
    }
    local_10[1].PackPositions =
         (UInt64 *)(*(long *)(local_10 + 1) + (long)local_10[1].PackPositions);
    SVar5 = ReadNumber(local_18,&local_40);
    if (SVar5 != 0) {
      return SVar5;
    }
    local_110 = 0;
  }
  if (local_40 == 0) {
    return 0;
  }
  if (local_40 != 5) {
    return 0x10;
  }
  SVar5 = SzReadNumber32((CSzData *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                         (UInt32 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (SVar5 != 0) {
    return SVar5;
  }
  *(UInt32 *)&local_10[1].FolderCRCs.Defs = local_44;
  local_114 = 0;
LAB_009ebf89:
  do {
    SVar5 = ReadNumber(local_18,(UInt64 *)&local_120);
    if (SVar5 != 0) {
      return SVar5;
    }
    if (CONCAT44(uStack_11c,local_120) == 0) {
      if (local_44 - local_48 != (int)local_80.Alloc) {
        return 0x10;
      }
      while( true ) {
        SVar5 = ReadNumber(local_18,(UInt64 *)&stack0xfffffffffffffe68);
        if (SVar5 != 0) {
          return SVar5;
        }
        if (in_stack_fffffffffffffe68 == (ILookInStream *)0x0) break;
        SVar5 = SkipData(in_stack_fffffffffffffdd8);
        if (SVar5 != 0) {
          return SVar5;
        }
      }
      uVar23 = 0;
      folderIndex_00 = 0;
      local_1b0 = 0;
      iVar22 = 0;
      uVar21 = 0;
      pcVar20 = (char *)0x0;
      pcVar19 = (char *)0x0;
      uVar18 = 0;
      uVar11 = 0x80;
      pUVar7 = (UInt32 *)(**(code **)local_38)(local_38,(ulong)(local_10->NumFolders + 1) << 2);
      local_10[2].FolderCRCs.Vals = pUVar7;
      if (pUVar7 == (UInt32 *)0x0) {
        return 2;
      }
      if (*(int *)&local_10[1].FolderCRCs.Defs == 0) {
        local_10[2].FoCodersOffsets = (size_t *)0x0;
      }
      else {
        psVar8 = (size_t *)
                 (**(code **)local_38)(local_38,(ulong)*(uint *)&local_10[1].FolderCRCs.Defs << 2);
        local_10[2].FoCodersOffsets = psVar8;
        if (psVar8 == (size_t *)0x0) {
          return 2;
        }
      }
      pUVar7 = (UInt32 *)
               (**(code **)local_38)
                         (local_38,(ulong)(*(int *)&local_10[1].FolderCRCs.Defs + 1) << 3);
      local_10[1].FolderCRCs.Vals = pUVar7;
      if (pUVar7 == (UInt32 *)0x0) {
        return 2;
      }
      if (*(int *)&local_10[1].FolderCRCs.Defs + 7U >> 3 == 0) {
        local_10[1].FoCodersOffsets = (size_t *)0x0;
      }
      else {
        psVar8 = (size_t *)
                 (**(code **)local_38)(local_38,*(int *)&local_10[1].FolderCRCs.Defs + 7U >> 3);
        local_10[1].FoCodersOffsets = psVar8;
        if (psVar8 == (size_t *)0x0) {
          return 2;
        }
      }
      SVar5 = SzBitUi32s_Alloc((CSzBitUi32s *)in_stack_fffffffffffffdd8,
                               (size_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      if (SVar5 != 0) {
        return SVar5;
      }
      if (local_50 != 0) {
        if (local_50 == 0) {
          return 0x10;
        }
        local_50 = local_50 + -1;
        pcVar10 = local_58 + 1;
        cVar2 = *local_58;
        uVar11 = CONCAT13(cVar2,(int3)uVar11);
        pcVar19 = pcVar10;
        local_58 = pcVar10;
        if (cVar2 == '\0') {
          pcVar19 = pcVar10 + (local_80.Alloc._4_4_ + 7U >> 3);
          pcVar20 = pcVar10;
        }
      }
      uVar17 = 0;
      uVar24 = 0;
      do {
        uVar12 = (undefined1)(uVar11 >> 8);
        uVar14 = (undefined1)(uVar11 >> 0x10);
        if (local_44 <= uVar24) {
          if ((char)uVar11 != -0x80) {
            in_stack_fffffffffffffde8 = uVar24 - 1 >> 3;
            *(undefined1 *)((long)local_10[1].FoCodersOffsets + (ulong)in_stack_fffffffffffffde8) =
                 uVar14;
            *(undefined1 *)
             ((long)local_10[1].FoStartPackStreamIndex + (ulong)in_stack_fffffffffffffde8) = uVar12;
          }
          *(ulong *)(local_10[1].FolderCRCs.Vals + (ulong)uVar24 * 2) = uVar21;
          if (local_1b0 == 0) {
            for (; local_10[2].FolderCRCs.Vals[folderIndex_00] = uVar24,
                folderIndex_00 < local_10->NumFolders; folderIndex_00 = folderIndex_00 + 1) {
              if (local_80.Free == (_func_void_void_ptr_void_ptr *)0x0) {
                return 0x10;
              }
              SVar5 = SzReadNumber32((CSzData *)
                                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                     (UInt32 *)
                                     CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
              if (SVar5 != 0) {
                return SVar5;
              }
              if (iVar22 != 0) {
                return 0x10;
              }
              in_stack_fffffffffffffde4 = 0;
              iVar22 = 0;
            }
            if ((local_80.Free == (_func_void_void_ptr_void_ptr *)0x0) || (local_70 == 0)) {
              local_4 = 0;
            }
            else {
              local_4 = 0x10;
            }
          }
          else {
            local_4 = 0x10;
          }
          return local_4;
        }
        if ((char)uVar11 == '\0') {
          uVar6 = uVar24 - 1 >> 3;
          *(undefined1 *)((long)local_10[1].FoCodersOffsets + (ulong)uVar6) = uVar14;
          *(undefined1 *)((long)local_10[1].FoStartPackStreamIndex + (ulong)uVar6) = uVar12;
          uVar11 = CONCAT31((uint3)(uVar11 >> 8) & 0xff0000,0x80);
        }
        *(ulong *)(local_10[1].FolderCRCs.Vals + (ulong)uVar24 * 2) = uVar21;
        local_10[1].FoToCoderUnpackSizes[uVar24] = 0;
        if ((local_88 == (Byte *)0x0) ||
           (((uint)local_88[uVar24 >> 3] & 0x80 >> ((byte)uVar24 & 7)) == 0)) {
LAB_009ecbf7:
          if (local_1b0 == 0) {
            while( true ) {
              if (local_10->NumFolders <= folderIndex_00) {
                return 0x10;
              }
              local_10[2].FolderCRCs.Vals[folderIndex_00] = uVar24;
              iVar22 = 1;
              if ((local_80.Free != (_func_void_void_ptr_void_ptr *)0x0) &&
                 (SVar5 = SzReadNumber32((CSzData *)
                                         CONCAT44(in_stack_fffffffffffffdec,
                                                  in_stack_fffffffffffffde8),
                                         (UInt32 *)
                                         CONCAT44(in_stack_fffffffffffffde4,
                                                  in_stack_fffffffffffffde0)), SVar5 != 0)) {
                return SVar5;
              }
              local_1b0 = iVar22;
              if (iVar22 != 0) break;
              UVar9 = SzAr_GetFolderUnpackSize(local_10,folderIndex_00);
              uVar21 = UVar9 + uVar21;
              if (uVar21 < UVar9) {
                return 0x10;
              }
              folderIndex_00 = folderIndex_00 + 1;
            }
          }
          *(uint *)((long)local_10[2].FoCodersOffsets + (ulong)uVar24 * 4) = folderIndex_00;
          if ((local_88 == (Byte *)0x0) ||
             (((uint)local_88[uVar24 >> 3] & 0x80 >> ((byte)uVar24 & 7)) == 0)) {
            local_1b0 = local_1b0 + -1;
            if (local_1b0 == 0) {
              UVar9 = SzAr_GetFolderUnpackSize(local_10,folderIndex_00);
              lVar4 = *(long *)(local_10[1].FolderCRCs.Vals +
                               (ulong)local_10[2].FolderCRCs.Vals[folderIndex_00] * 2);
              if (UVar9 < uVar21 - lVar4) {
                return 0x10;
              }
              uVar21 = lVar4 + UVar9;
              if (uVar21 < UVar9) {
                return 0x10;
              }
              bVar13 = (byte)(uVar11 >> 8);
              uVar16 = (undefined2)(uVar11 >> 0x10);
              bVar15 = (byte)uVar11;
              if (((iVar22 == 1) && ((local_10->FolderCRCs).Defs != (Byte *)0x0)) &&
                 (((uint)(local_10->FolderCRCs).Defs[uVar24 >> 3] & 0x80 >> ((byte)uVar24 & 7)) != 0
                 )) {
                local_10[1].FoToCoderUnpackSizes[uVar24] =
                     (local_10->FolderCRCs).Vals[folderIndex_00];
                uVar11 = CONCAT22(uVar16,CONCAT11(bVar13 | bVar15,bVar15));
              }
              else if (((char)(uVar11 >> 0x18) != '\0') ||
                      ((pcVar20 != (char *)0x0 &&
                       (((uint)(byte)pcVar20[uVar17 >> 3] & 0x80 >> ((byte)uVar17 & 7)) != 0)))) {
                local_10[1].FoToCoderUnpackSizes[uVar24] = *(UInt32 *)(pcVar19 + (ulong)uVar18 * 4);
                uVar18 = uVar18 + 1;
                uVar11 = CONCAT22(uVar16,CONCAT11(bVar13 | bVar15,bVar15));
              }
              folderIndex_00 = folderIndex_00 + 1;
            }
            else {
              SVar5 = ReadNumber(&local_68,(UInt64 *)&stack0xfffffffffffffdf0);
              if (SVar5 != 0) {
                return SVar5;
              }
              uVar21 = CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0) + uVar21;
              if (uVar21 < CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0)) {
                return 0x10;
              }
              if (((char)(uVar11 >> 0x18) != '\0') ||
                 ((pcVar20 != (char *)0x0 &&
                  (((uint)(byte)pcVar20[uVar17 >> 3] & 0x80 >> ((byte)uVar17 & 7)) != 0)))) {
                local_10[1].FoToCoderUnpackSizes[uVar24] = *(UInt32 *)(pcVar19 + (ulong)uVar18 * 4);
                uVar18 = uVar18 + 1;
                uVar11 = CONCAT22((short)(uVar11 >> 0x10),
                                  CONCAT11((byte)(uVar11 >> 8) | (byte)uVar11,(byte)uVar11));
              }
              in_stack_fffffffffffffdec = 0;
            }
          }
        }
        else {
          bVar15 = (byte)(uVar11 >> 0x10);
          uVar12 = (undefined1)(uVar11 >> 0x18);
          if (local_90 == (Byte *)0x0) {
            uVar11 = CONCAT13(uVar12,CONCAT12(bVar15 | (byte)uVar11,(short)uVar11));
          }
          else {
            if (((uint)local_90[uVar23 >> 3] & 0x80 >> ((byte)uVar23 & 7)) == 0) {
              uVar11 = CONCAT13(uVar12,CONCAT12(bVar15 | (byte)uVar11,(short)uVar11));
            }
            uVar23 = uVar23 + 1;
          }
          if (local_1b0 != 0) goto LAB_009ecbf7;
          *(undefined4 *)((long)local_10[2].FoCodersOffsets + (ulong)uVar24 * 4) = 0xffffffff;
        }
        uVar24 = uVar24 + 1;
        uVar11 = CONCAT31((int3)(uVar11 >> 8),(char)((int)(uVar11 & 0xff) >> 1));
      } while( true );
    }
    SVar5 = ReadNumber(local_18,&local_128);
    if (SVar5 != 0) {
      return SVar5;
    }
    if (local_18->Size < local_128) {
      return 0x10;
    }
    if (0xff < CONCAT44(uStack_11c,local_120)) {
      local_18->Size = local_18->Size - local_128;
      local_18->Data = local_18->Data + local_128;
      goto LAB_009ebf89;
    }
    in_stack_fffffffffffffdd8 = (CSzData *)(ulong)(local_120 - 0xe);
    numTempBufs_00 = (UInt32)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    switch(in_stack_fffffffffffffdd8) {
    case (CSzData *)0x0:
      SVar5 = RememberBitVector(local_18,local_44,&local_88);
      if (SVar5 != 0) {
        return SVar5;
      }
      local_48 = CountDefinedBits(local_88,local_44);
      local_90 = (Byte *)0x0;
      goto LAB_009ebf89;
    case (CSzData *)0x1:
      iVar22 = RememberBitVector(local_18,local_48,&local_90);
      break;
    default:
      local_18->Size = local_18->Size - local_128;
      local_18->Data = local_18->Data + local_128;
      goto LAB_009ebf89;
    case (CSzData *)0x3:
      if (local_18->Size == 0) {
        return 0x10;
      }
      local_18->Size = local_18->Size - 1;
      pBVar3 = local_18->Data;
      local_18->Data = pBVar3 + 1;
      BVar1 = *pBVar3;
      if (BVar1 == '\0') {
        local_138 = local_128 - 1;
        local_140 = local_18->Data;
      }
      else {
        SVar5 = SzReadNumber32((CSzData *)
                               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                               (UInt32 *)
                               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        if (SVar5 != 0) {
          return SVar5;
        }
        if (*local_30 <= local_148) {
          return 0x10;
        }
        local_140 = *(Byte **)(local_28 + (ulong)local_148 * 0x10);
        local_138 = *(ulong *)(local_28 + (ulong)local_148 * 0x10 + 8);
      }
      if ((local_138 & 1) != 0) {
        return 0x10;
      }
      pUVar7 = (UInt32 *)(**(code **)local_38)(local_38,(ulong)(local_44 + 1) << 3);
      local_10[2].FoStartPackStreamIndex = pUVar7;
      if (pUVar7 == (UInt32 *)0x0) {
        return 2;
      }
      if (local_138 == 0) {
        local_10 = (CSzAr *)0x0;
      }
      else {
        pUVar7 = (UInt32 *)(**(code **)local_38)(local_38,local_138);
        local_10[2].FoToCoderUnpackSizes = pUVar7;
        if (pUVar7 == (UInt32 *)0x0) {
          return 2;
        }
        memcpy(local_10[2].FoToCoderUnpackSizes,local_140,local_138);
      }
      SVar5 = SzReadFileNames((Byte *)local_10[2].FoToCoderUnpackSizes,local_138,local_44,
                              (size_t *)local_10[2].FoStartPackStreamIndex);
      if (SVar5 != 0) {
        return SVar5;
      }
      if (BVar1 == '\0') {
        local_18->Size = local_18->Size - local_138;
        local_18->Data = local_18->Data + local_138;
      }
      goto LAB_009ebf89;
    case (CSzData *)0x4:
      iVar22 = ReadTime((CSzBitUi64s *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                        ,in_stack_fffffffffffffe24,(CSzData *)in_stack_fffffffffffffe18,
                        (CBuf *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        numTempBufs_00,in_stack_fffffffffffffe00);
      break;
    case (CSzData *)0x6:
      iVar22 = ReadTime((CSzBitUi64s *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                        ,in_stack_fffffffffffffe24,(CSzData *)in_stack_fffffffffffffe18,
                        (CBuf *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                        numTempBufs_00,in_stack_fffffffffffffe00);
      break;
    case (CSzData *)0x7:
      SzBitUi32s_Free((CSzBitUi32s *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      SVar5 = ReadBitVector(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                            (Byte **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                            (ISzAlloc *)
                            CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      if (SVar5 != 0) {
        return SVar5;
      }
      if (local_18->Size == 0) {
        return 0x10;
      }
      local_18->Size = local_18->Size - 1;
      pBVar3 = local_18->Data;
      local_18->Data = pBVar3 + 1;
      if (*pBVar3 != '\0') {
        SVar5 = SzReadNumber32((CSzData *)
                               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                               (UInt32 *)
                               CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        if (SVar5 != 0) {
          return SVar5;
        }
        if (*local_30 <= in_stack_fffffffffffffe80) {
          return 0x10;
        }
      }
      iVar22 = ReadUi32s(in_stack_fffffffffffffe08,
                         (UInt32)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                         (CSzBitUi32s *)in_stack_fffffffffffffdf8,
                         (ISzAlloc *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    }
    if (iVar22 != 0) {
      return iVar22;
    }
  } while( true );
}

Assistant:

static SRes SzReadHeader2(
    CSzArEx *p,   /* allocMain */
    CSzData *sd,
    ILookInStream *inStream,
    CBuf *tempBufs, UInt32 *numTempBufs,
    ISzAlloc *allocMain,
    ISzAlloc *allocTemp
    )
{
  UInt64 type;
  UInt32 numFiles = 0;
  UInt32 numEmptyStreams = 0;
  CSubStreamInfo ssi;
  const Byte *emptyStreams = NULL;
  const Byte *emptyFiles = NULL;

  SzData_Clear(&ssi.sdSizes);
  SzData_Clear(&ssi.sdCRCs);
  SzData_Clear(&ssi.sdNumSubStreams);

  ssi.NumSubDigests = 0;
  ssi.NumTotalSubStreams = 0;

  RINOK(ReadID(sd, &type));

  if (type == k7zIdArchiveProperties)
  {
    for (;;)
    {
      UInt64 type;
      RINOK(ReadID(sd, &type));
      if (type == k7zIdEnd)
        break;
      RINOK(SkipData(sd));
    }
    RINOK(ReadID(sd, &type));
  }

  if (type == k7zIdAdditionalStreamsInfo)
  {
    CSzAr tempAr;
    SRes res;
    
    SzAr_Init(&tempAr);
    res = SzReadAndDecodePackedStreams(inStream, sd, tempBufs, NUM_ADDITIONAL_STREAMS_MAX,
        p->startPosAfterHeader, &tempAr, allocTemp);
    *numTempBufs = tempAr.NumFolders;
    SzAr_Free(&tempAr, allocTemp);
    
    if (res != SZ_OK)
      return res;
    RINOK(ReadID(sd, &type));
  }

  if (type == k7zIdMainStreamsInfo)
  {
    RINOK(SzReadStreamsInfo(&p->db, sd, (UInt32)1 << 30, tempBufs, *numTempBufs,
        &p->dataPos, &ssi, allocMain));
    p->dataPos += p->startPosAfterHeader;
    RINOK(ReadID(sd, &type));
  }

  if (type == k7zIdEnd)
  {
    return SZ_OK;
  }

  if (type != k7zIdFilesInfo)
    return SZ_ERROR_ARCHIVE;
  
  RINOK(SzReadNumber32(sd, &numFiles));
  p->NumFiles = numFiles;

  for (;;)
  {
    UInt64 type;
    UInt64 size;
    RINOK(ReadID(sd, &type));
    if (type == k7zIdEnd)
      break;
    RINOK(ReadNumber(sd, &size));
    if (size > sd->Size)
      return SZ_ERROR_ARCHIVE;
    
    if (type >= ((UInt32)1 << 8))
    {
      SKIP_DATA(sd, size);
    }
    else switch ((unsigned)type)
    {
      case k7zIdName:
      {
        size_t namesSize;
        const Byte *namesData;
        Byte external;

        SZ_READ_BYTE(external);
        if (external == 0)
        {
          namesSize = (size_t)size - 1;
          namesData = sd->Data;
        }
        else
        {
          UInt32 index;
          RINOK(SzReadNumber32(sd, &index));
          if (index >= *numTempBufs)
            return SZ_ERROR_ARCHIVE;
          namesData = (tempBufs)[index].data;
          namesSize = (tempBufs)[index].size;
        }

        if ((namesSize & 1) != 0)
          return SZ_ERROR_ARCHIVE;
        MY_ALLOC(size_t, p->FileNameOffsets, numFiles + 1, allocMain);
        MY_ALLOC_ZE_AND_CPY(p->FileNames, namesSize, namesData, allocMain);
        RINOK(SzReadFileNames(p->FileNames, namesSize, numFiles, p->FileNameOffsets))
        if (external == 0)
        {
          SKIP_DATA(sd, namesSize);
        }
        break;
      }
      case k7zIdEmptyStream:
      {
        RINOK(RememberBitVector(sd, numFiles, &emptyStreams));
        numEmptyStreams = CountDefinedBits(emptyStreams, numFiles);
        emptyFiles = NULL;
        break;
      }
      case k7zIdEmptyFile:
      {
        RINOK(RememberBitVector(sd, numEmptyStreams, &emptyFiles));
        break;
      }
      case k7zIdWinAttrib:
      {
        Byte external;
        CSzData sdSwitch;
        CSzData *sdPtr;
        SzBitUi32s_Free(&p->Attribs, allocMain);
        RINOK(ReadBitVector(sd, numFiles, &p->Attribs.Defs, allocMain));

        SZ_READ_BYTE(external);
        if (external == 0)
          sdPtr = sd;
        else
        {
          UInt32 index;
          RINOK(SzReadNumber32(sd, &index));
          if (index >= *numTempBufs)
            return SZ_ERROR_ARCHIVE;
          sdSwitch.Data = (tempBufs)[index].data;
          sdSwitch.Size = (tempBufs)[index].size;
          sdPtr = &sdSwitch;
        }
        RINOK(ReadUi32s(sdPtr, numFiles, &p->Attribs, allocMain));
        break;
      }
      /*
      case k7zParent:
      {
        SzBitUi32s_Free(&p->Parents, allocMain);
        RINOK(ReadBitVector(sd, numFiles, &p->Parents.Defs, allocMain));
        RINOK(SzReadSwitch(sd));
        RINOK(ReadUi32s(sd, numFiles, &p->Parents, allocMain));
        break;
      }
      */
      case k7zIdMTime: RINOK(ReadTime(&p->MTime, numFiles, sd, tempBufs, *numTempBufs, allocMain)); break;
      case k7zIdCTime: RINOK(ReadTime(&p->CTime, numFiles, sd, tempBufs, *numTempBufs, allocMain)); break;
      default:
      {
        SKIP_DATA(sd, size);
      }
    }
  }

  if (numFiles - numEmptyStreams != ssi.NumTotalSubStreams)
    return SZ_ERROR_ARCHIVE;

  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == k7zIdEnd)
      break;
    RINOK(SkipData(sd));
  }

  {
    UInt32 i;
    UInt32 emptyFileIndex = 0;
    UInt32 folderIndex = 0;
    UInt32 remSubStreams = 0;
    UInt32 numSubStreams = 0;
    UInt64 unpackPos = 0;
    const Byte *digestsDefs = NULL;
    const Byte *digestsVals = NULL;
    UInt32 digestsValsIndex = 0;
    UInt32 digestIndex;
    Byte allDigestsDefined = 0;
    Byte isDirMask = 0;
    Byte crcMask = 0;
    Byte mask = 0x80;
    
    MY_ALLOC(UInt32, p->FolderToFile, p->db.NumFolders + 1, allocMain);
    MY_ALLOC_ZE(UInt32, p->FileToFolder, p->NumFiles, allocMain);
    MY_ALLOC(UInt64, p->UnpackPositions, p->NumFiles + 1, allocMain);
    MY_ALLOC_ZE(Byte, p->IsDirs, (p->NumFiles + 7) >> 3, allocMain);

    RINOK(SzBitUi32s_Alloc(&p->CRCs, p->NumFiles, allocMain));

    if (ssi.sdCRCs.Size != 0)
    {
      SZ_READ_BYTE_SD(&ssi.sdCRCs, allDigestsDefined);
      if (allDigestsDefined)
        digestsVals = ssi.sdCRCs.Data;
      else
      {
        size_t numBytes = (ssi.NumSubDigests + 7) >> 3;
        digestsDefs = ssi.sdCRCs.Data;
        digestsVals = digestsDefs + numBytes;
      }
    }

    digestIndex = 0;
    
    for (i = 0; i < numFiles; i++, mask >>= 1)
    {
      if (mask == 0)
      {
        UInt32 byteIndex = (i - 1) >> 3;
        p->IsDirs[byteIndex] = isDirMask;
        p->CRCs.Defs[byteIndex] = crcMask;
        isDirMask = 0;
        crcMask = 0;
        mask = 0x80;
      }

      p->UnpackPositions[i] = unpackPos;
      p->CRCs.Vals[i] = 0;
      
      if (emptyStreams && SzBitArray_Check(emptyStreams, i))
      {
        if (emptyFiles)
        {
          if (!SzBitArray_Check(emptyFiles, emptyFileIndex))
            isDirMask |= mask;
          emptyFileIndex++;
        }
        else
          isDirMask |= mask;
        if (remSubStreams == 0)
        {
          p->FileToFolder[i] = (UInt32)-1;
          continue;
        }
      }
      
      if (remSubStreams == 0)
      {
        for (;;)
        {
          if (folderIndex >= p->db.NumFolders)
            return SZ_ERROR_ARCHIVE;
          p->FolderToFile[folderIndex] = i;
          numSubStreams = 1;
          if (ssi.sdNumSubStreams.Data)
          {
            RINOK(SzReadNumber32(&ssi.sdNumSubStreams, &numSubStreams));
          }
          remSubStreams = numSubStreams;
          if (numSubStreams != 0)
            break;
          {
            UInt64 folderUnpackSize = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
            unpackPos += folderUnpackSize;
            if (unpackPos < folderUnpackSize)
              return SZ_ERROR_ARCHIVE;
          }

          folderIndex++;
        }
      }
      
      p->FileToFolder[i] = folderIndex;
      
      if (emptyStreams && SzBitArray_Check(emptyStreams, i))
        continue;
      
      if (--remSubStreams == 0)
      {
        UInt64 folderUnpackSize = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
        UInt64 startFolderUnpackPos = p->UnpackPositions[p->FolderToFile[folderIndex]];
        if (folderUnpackSize < unpackPos - startFolderUnpackPos)
          return SZ_ERROR_ARCHIVE;
        unpackPos = startFolderUnpackPos + folderUnpackSize;
        if (unpackPos < folderUnpackSize)
          return SZ_ERROR_ARCHIVE;

        if (numSubStreams == 1 && SzBitWithVals_Check(&p->db.FolderCRCs, i))
        {
          p->CRCs.Vals[i] = p->db.FolderCRCs.Vals[folderIndex];
          crcMask |= mask;
        }
        else if (allDigestsDefined || (digestsDefs && SzBitArray_Check(digestsDefs, digestIndex)))
        {
          p->CRCs.Vals[i] = GetUi32(digestsVals + (size_t)digestsValsIndex * 4);
          digestsValsIndex++;
          crcMask |= mask;
        }
        
        folderIndex++;
      }
      else
      {
        UInt64 v;
        RINOK(ReadNumber(&ssi.sdSizes, &v));
        unpackPos += v;
        if (unpackPos < v)
          return SZ_ERROR_ARCHIVE;
        if (allDigestsDefined || (digestsDefs && SzBitArray_Check(digestsDefs, digestIndex)))
        {
          p->CRCs.Vals[i] = GetUi32(digestsVals + (size_t)digestsValsIndex * 4);
          digestsValsIndex++;
          crcMask |= mask;
        }
      }
    }

    if (mask != 0x80)
    {
      UInt32 byteIndex = (i - 1) >> 3;
      p->IsDirs[byteIndex] = isDirMask;
      p->CRCs.Defs[byteIndex] = crcMask;
    }
    
    p->UnpackPositions[i] = unpackPos;

    if (remSubStreams != 0)
      return SZ_ERROR_ARCHIVE;

    for (;;)
    {
      p->FolderToFile[folderIndex] = i;
      if (folderIndex >= p->db.NumFolders)
        break;
      if (!ssi.sdNumSubStreams.Data)
        return SZ_ERROR_ARCHIVE;
      RINOK(SzReadNumber32(&ssi.sdNumSubStreams, &numSubStreams));
      if (numSubStreams != 0)
        return SZ_ERROR_ARCHIVE;
      /*
      {
        UInt64 folderUnpackSize = SzAr_GetFolderUnpackSize(&p->db, folderIndex);
        unpackPos += folderUnpackSize;
        if (unpackPos < folderUnpackSize)
          return SZ_ERROR_ARCHIVE;
      }
      */
      folderIndex++;
    }

    if (ssi.sdNumSubStreams.Data && ssi.sdNumSubStreams.Size != 0)
      return SZ_ERROR_ARCHIVE;
  }
  
  return SZ_OK;
}